

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FOCC-CTA-cs16btech11038.cpp
# Opt level: O0

int __thiscall FOCC_CTA::begin_trans(FOCC_CTA *this)

{
  Transaction *this_00;
  mapped_type *ppTVar1;
  int local_14;
  FOCC_CTA *pFStack_10;
  int id;
  FOCC_CTA *this_local;
  
  pFStack_10 = this;
  std::shared_mutex::lock(&this->scheduler_lock);
  local_14 = this->counter;
  this_00 = (Transaction *)operator_new(0xc0);
  Transaction::Transaction(this_00,local_14,this->M);
  ppTVar1 = std::
            map<int,_Transaction_*,_std::less<int>,_std::allocator<std::pair<const_int,_Transaction_*>_>_>
            ::operator[](&this->transactions,&local_14);
  *ppTVar1 = this_00;
  this->counter = this->counter + 1;
  std::shared_mutex::unlock(&this->scheduler_lock);
  return local_14;
}

Assistant:

int FOCC_CTA::begin_trans() {
    scheduler_lock.lock();

    //if(transactions.size()>FOCC_OTA_GARB_THRESH) garbageCollect();

    int id = counter;
    transactions[id] = new Transaction(id, M);
    counter++;
    scheduler_lock.unlock();

    return id;
}